

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-traits.cpp
# Opt level: O3

bool ggml_cpu_extra_work_size(int n_threads,ggml_tensor *op,size_t *size)

{
  pointer ppgVar1;
  char cVar2;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *pvVar3;
  long *plVar4;
  pointer ppgVar5;
  
  pvVar3 = ggml_backend_cpu_get_extra_buffers_type();
  ppgVar5 = (pvVar3->
            super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppgVar1 = (pvVar3->
            super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppgVar5 == ppgVar1) {
      return false;
    }
    if ((((*ppgVar5 != (ggml_backend_buffer_type *)0x0) &&
         (plVar4 = (long *)(*ppgVar5)->context, plVar4 != (long *)0x0)) &&
        (plVar4 = (long *)(**(code **)(*plVar4 + 0x18))(plVar4,op), plVar4 != (long *)0x0)) &&
       (cVar2 = (**(code **)(*plVar4 + 0x10))(plVar4,n_threads,op,size), cVar2 != '\0')) break;
    ppgVar5 = ppgVar5 + 1;
  }
  return true;
}

Assistant:

bool ggml_cpu_extra_work_size(int n_threads, const struct ggml_tensor * op, size_t * size) {
    for (auto extra : ggml_backend_cpu_get_extra_buffers_type()) {
        if (extra && extra->context) {
            auto buf_extra     = (ggml::cpu::extra_buffer_type *) extra->context;
            auto tensor_traits = buf_extra->get_tensor_traits(op);
            if (tensor_traits && tensor_traits->work_size(n_threads, op, *size)) {
                return true;
            }
        }
    }
    return false;
}